

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O0

IncludeResult * __thiscall
Diligent::GLSLangUtils::anon_unknown_4::IncluderImpl::includeSystem
          (IncluderImpl *this,char *headerName,char *param_2,size_t param_3)

{
  IShaderSourceInputStreamFactory *pIVar1;
  Char *Message;
  IFileStream **ppIVar2;
  IFileStream *pIVar3;
  DataBlobImpl *pDVar4;
  IncluderImpl *this_00;
  char *pcVar5;
  size_t headerLength;
  allocator<char> local_b1;
  string local_b0;
  IncluderImpl *local_90;
  IncludeResult *pNewInclude;
  RefCntAutoPtr<Diligent::DataBlobImpl> pFileData;
  DoublePtrHelper<Diligent::IFileStream> local_78;
  RefCntAutoPtr<Diligent::IFileStream> local_68;
  RefCntAutoPtr<Diligent::IFileStream> pSourceStream;
  undefined1 local_50 [8];
  string msg;
  size_t param_3_local;
  char *param_2_local;
  char *headerName_local;
  IncluderImpl *this_local;
  
  msg.field_2._8_8_ = param_3;
  param_2_local = headerName;
  headerName_local = (char *)this;
  if (this->m_pInputStreamFactory == (IShaderSourceInputStreamFactory *)0x0) {
    FormatString<char[89]>
              ((string *)local_50,
               (char (*) [89])
               "The shader source contains #include directives, but no input stream factory was provided"
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"includeSystem",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x136);
    std::__cxx11::string::~string((string *)local_50);
  }
  RefCntAutoPtr<Diligent::IFileStream>::RefCntAutoPtr(&local_68);
  pcVar5 = param_2_local;
  pIVar1 = this->m_pInputStreamFactory;
  RefCntAutoPtr<Diligent::IFileStream>::operator&((RefCntAutoPtr<Diligent::IFileStream> *)&local_78)
  ;
  ppIVar2 = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_IFileStream__
                      ((DoublePtrHelper *)&local_78);
  (*(pIVar1->super_IObject)._vptr_IObject[4])(pIVar1,pcVar5,ppIVar2);
  RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
            (&local_78);
  pIVar3 = Diligent::RefCntAutoPtr::operator_cast_to_IFileStream_((RefCntAutoPtr *)&local_68);
  if (pIVar3 == (IFileStream *)0x0) {
    LogError<false,char[37],char_const*,char[30]>
              (false,"includeSystem",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x13b,(char (*) [37])"Failed to open shader include file \'",&param_2_local,
               (char (*) [30])"\'. Check that the file exists");
    this_local = (IncluderImpl *)0x0;
    pFileData.m_pObject._4_4_ = 1;
  }
  else {
    DataBlobImpl::Create((DataBlobImpl *)&pNewInclude,0,(void *)0x0);
    pIVar3 = RefCntAutoPtr<Diligent::IFileStream>::operator->(&local_68);
    pDVar4 = Diligent::RefCntAutoPtr::operator_cast_to_DataBlobImpl_((RefCntAutoPtr *)&pNewInclude);
    (*(pIVar3->super_IObject)._vptr_IObject[5])(pIVar3,pDVar4);
    this_00 = (IncluderImpl *)::operator_new(0x38);
    pcVar5 = param_2_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar5,&local_b1);
    pDVar4 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                       ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&pNewInclude);
    pcVar5 = DataBlobImpl::GetConstDataPtr<char>(pDVar4,0);
    pDVar4 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                       ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&pNewInclude);
    headerLength = DataBlobImpl::GetSize(pDVar4);
    glslang::TShader::Includer::IncludeResult::IncludeResult
              ((IncludeResult *)this_00,&local_b0,pcVar5,headerLength,(void *)0x0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    local_90 = this_00;
    std::
    unordered_set<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>,std::hash<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>>,std::equal_to<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>>,std::allocator<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>>>
    ::emplace<glslang::TShader::Includer::IncludeResult*&>
              ((unordered_set<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>,std::hash<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>>,std::equal_to<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>>,std::allocator<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>>>
                *)&this->m_IncludeRes,(IncludeResult **)&local_90);
    std::
    unordered_map<glslang::TShader::Includer::IncludeResult*,Diligent::RefCntAutoPtr<Diligent::IDataBlob>,std::hash<glslang::TShader::Includer::IncludeResult*>,std::equal_to<glslang::TShader::Includer::IncludeResult*>,std::allocator<std::pair<glslang::TShader::Includer::IncludeResult*const,Diligent::RefCntAutoPtr<Diligent::IDataBlob>>>>
    ::
    emplace<glslang::TShader::Includer::IncludeResult*&,Diligent::RefCntAutoPtr<Diligent::DataBlobImpl>>
              ((unordered_map<glslang::TShader::Includer::IncludeResult*,Diligent::RefCntAutoPtr<Diligent::IDataBlob>,std::hash<glslang::TShader::Includer::IncludeResult*>,std::equal_to<glslang::TShader::Includer::IncludeResult*>,std::allocator<std::pair<glslang::TShader::Includer::IncludeResult*const,Diligent::RefCntAutoPtr<Diligent::IDataBlob>>>>
                *)&this->m_DataBlobs,(IncludeResult **)&local_90,
               (RefCntAutoPtr<Diligent::DataBlobImpl> *)&pNewInclude);
    this_local = local_90;
    pFileData.m_pObject._4_4_ = 1;
    RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&pNewInclude);
  }
  RefCntAutoPtr<Diligent::IFileStream>::~RefCntAutoPtr(&local_68);
  return (IncludeResult *)this_local;
}

Assistant:

virtual IncludeResult* includeSystem(const char* headerName,
                                         const char* /*includerName*/,
                                         size_t /*inclusionDepth*/)
    {
        DEV_CHECK_ERR(m_pInputStreamFactory != nullptr, "The shader source contains #include directives, but no input stream factory was provided");
        RefCntAutoPtr<IFileStream> pSourceStream;
        m_pInputStreamFactory->CreateInputStream(headerName, &pSourceStream);
        if (pSourceStream == nullptr)
        {
            LOG_ERROR("Failed to open shader include file '", headerName, "'. Check that the file exists");
            return nullptr;
        }

        auto pFileData = DataBlobImpl::Create();
        pSourceStream->ReadBlob(pFileData);
        auto* pNewInclude =
            new IncludeResult{
                headerName,
                pFileData->GetConstDataPtr<char>(),
                pFileData->GetSize(),
                nullptr};

        m_IncludeRes.emplace(pNewInclude);
        m_DataBlobs.emplace(pNewInclude, std::move(pFileData));
        return pNewInclude;
    }